

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool google::protobuf::anon_unknown_1::RetrieveOptions
               (int depth,Message *options,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int iVar6;
  int iVar7;
  ulong uVar8;
  string name;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  string fieldval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Printer printer;
  long *plVar5;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(option_entries);
  iVar3 = (*(options->super_MessageLite)._vptr_MessageLite[0x12])(options);
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar5 + 0x60))();
  for (uVar8 = 0;
      uVar8 < (ulong)((long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    iVar3 = *(int *)(fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8] + 0x30);
    iVar4 = 1;
    if (iVar3 == 3) {
      iVar4 = (**(code **)(*plVar5 + 0x30))(plVar5,options);
    }
    iVar7 = 0;
    if (iVar4 < 1) {
      iVar4 = iVar7;
    }
    for (; iVar4 != iVar7; iVar7 = iVar7 + 1) {
      fieldval._M_dataplus._M_p = (pointer)&fieldval.field_2;
      fieldval._M_string_length = 0;
      fieldval.field_2._M_local_buf[0] = '\0';
      if ((*(uint *)(fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8] + 0x2c) & 0xfffffffe) == 10) {
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        name.field_2._M_local_buf[0] = '\0';
        TextFormat::Printer::Printer(&printer);
        iVar6 = -1;
        if (iVar3 == 3) {
          iVar6 = iVar7;
        }
        printer.initial_indent_level_ = depth + 1;
        TextFormat::Printer::PrintFieldValueToString
                  (&printer,options,
                   fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar8],iVar6,&name);
        std::__cxx11::string::append((char *)&fieldval);
        std::__cxx11::string::append((string *)&fieldval);
        std::__cxx11::string::append((ulong)&fieldval,(char)depth * '\x02');
        std::__cxx11::string::append((char *)&fieldval);
        TextFormat::Printer::~Printer(&printer);
        std::__cxx11::string::~string((string *)&name);
      }
      else {
        iVar6 = -1;
        if (iVar3 == 3) {
          iVar6 = iVar7;
        }
        TextFormat::PrintFieldValueToString
                  (options,fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar8],iVar6,&fieldval);
      }
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      if (fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar8][0x34] == (FieldDescriptor)0x1) {
        std::operator+(&local_70,"(.",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar8] + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer
                       ,&local_70,")");
        std::__cxx11::string::operator=((string *)&name,(string *)&printer);
        std::__cxx11::string::~string((string *)&printer);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&name);
      }
      std::operator+(&local_70,&name," = ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer,
                     &local_70,&fieldval);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)option_entries
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&printer);
      std::__cxx11::string::~string((string *)&printer);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&fieldval);
    }
  }
  pbVar1 = (option_entries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (option_entries->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return pbVar1 != pbVar2;
}

Assistant:

bool RetrieveOptions(int depth,
                     const Message &options,
                     vector<string> *option_entries) {
  option_entries->clear();
  const Reflection* reflection = options.GetReflection();
  vector<const FieldDescriptor*> fields;
  reflection->ListFields(options, &fields);
  for (int i = 0; i < fields.size(); i++) {
    int count = 1;
    bool repeated = false;
    if (fields[i]->is_repeated()) {
      count = reflection->FieldSize(options, fields[i]);
      repeated = true;
    }
    for (int j = 0; j < count; j++) {
      string fieldval;
      if (fields[i]->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        string tmp;
        TextFormat::Printer printer;
        printer.SetInitialIndentLevel(depth + 1);
        printer.PrintFieldValueToString(options, fields[i],
                                        repeated ? j : -1, &tmp);
        fieldval.append("{\n");
        fieldval.append(tmp);
        fieldval.append(depth * 2, ' ');
        fieldval.append("}");
      } else {
        TextFormat::PrintFieldValueToString(options, fields[i],
                                            repeated ? j : -1, &fieldval);
      }
      string name;
      if (fields[i]->is_extension()) {
        name = "(." + fields[i]->full_name() + ")";
      } else {
        name = fields[i]->name();
      }
      option_entries->push_back(name + " = " + fieldval);
    }
  }
  return !option_entries->empty();
}